

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O2

void __thiscall
UDPSplitAddrPacketReader::UDPSplitAddrPacketReader
          (UDPSplitAddrPacketReader *this,Socket *socket,int max,int mtu)

{
  *(undefined ***)&this->super_UDPSplitPacketReader = &PTR___cxa_pure_virtual_0011a9f8;
  UDPSplitPacketReader::UDPSplitPacketReader
            (&this->super_UDPSplitPacketReader,&PTR_PTR_0011a2d0,socket->sockfd,max,mtu);
  *(undefined ***)&this->super_UDPSplitPacketReader = &PTR_read_0011a2b0;
  return;
}

Assistant:

UDPSplitAddrPacketReader::UDPSplitAddrPacketReader(Socket &socket, int max, int mtu) : UDPSplitPacketReader(socket.sockfd, max, mtu) {}